

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::CollationDataBuilder::encodeCEs
          (CollationDataBuilder *this,int64_t *ces,int32_t cesLength,UErrorCode *errorCode)

{
  ulong uVar1;
  UBool UVar2;
  uint uVar3;
  uint32_t uVar4;
  int local_cc;
  uint32_t ce32;
  int32_t i;
  int32_t newCE32s [31];
  uint32_t p0;
  int64_t ce1;
  int64_t ce0;
  UErrorCode *errorCode_local;
  int32_t cesLength_local;
  int64_t *ces_local;
  CollationDataBuilder *this_local;
  
  UVar2 = ::U_FAILURE(*errorCode);
  if (UVar2 == '\0') {
    if ((cesLength < 0) || (0x1f < cesLength)) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      this_local._4_4_ = 0;
    }
    else if ((this->trie == (UTrie2 *)0x0) ||
            (UVar2 = utrie2_isFrozen_63(this->trie), UVar2 != '\0')) {
      *errorCode = U_INVALID_STATE_ERROR;
      this_local._4_4_ = 0;
    }
    else if (cesLength == 0) {
      this_local._4_4_ = encodeOneCEAsCE32(0);
    }
    else if (cesLength == 1) {
      this_local._4_4_ = encodeOneCE(this,*ces,errorCode);
    }
    else {
      if (cesLength == 2) {
        uVar1 = *ces;
        uVar3 = (uint)(uVar1 >> 0x20);
        if ((((uVar1 & 0xffffffffff00ff) == 0x5000000) && ((ces[1] & 0xffffffff00ffffffU) == 0x500))
           && (uVar3 != 0)) {
          return uVar3 | ((uint)uVar1 & 0xff00) << 8 | (uint)((ulong)ces[1] >> 0x10) | 0xc4;
        }
      }
      for (local_cc = 0; local_cc != cesLength; local_cc = local_cc + 1) {
        uVar4 = encodeOneCEAsCE32(ces[local_cc]);
        if (uVar4 == 1) {
          uVar4 = encodeExpansion(this,ces,cesLength,errorCode);
          return uVar4;
        }
        (&ce32)[local_cc] = uVar4;
      }
      this_local._4_4_ = encodeExpansion32(this,(int32_t *)&ce32,cesLength,errorCode);
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t
CollationDataBuilder::encodeCEs(const int64_t ces[], int32_t cesLength,
                                UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    if(cesLength < 0 || cesLength > Collation::MAX_EXPANSION_LENGTH) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    if(trie == NULL || utrie2_isFrozen(trie)) {
        errorCode = U_INVALID_STATE_ERROR;
        return 0;
    }
    if(cesLength == 0) {
        // Convenience: We cannot map to nothing, but we can map to a completely ignorable CE.
        // Do this here so that callers need not do it.
        return encodeOneCEAsCE32(0);
    } else if(cesLength == 1) {
        return encodeOneCE(ces[0], errorCode);
    } else if(cesLength == 2) {
        // Try to encode two CEs as one CE32.
        int64_t ce0 = ces[0];
        int64_t ce1 = ces[1];
        uint32_t p0 = (uint32_t)(ce0 >> 32);
        if((ce0 & INT64_C(0xffffffffff00ff)) == Collation::COMMON_SECONDARY_CE &&
                (ce1 & INT64_C(0xffffffff00ffffff)) == Collation::COMMON_TERTIARY_CE &&
                p0 != 0) {
            // Latin mini expansion
            return
                p0 |
                (((uint32_t)ce0 & 0xff00u) << 8) |
                (uint32_t)(ce1 >> 16) |
                Collation::SPECIAL_CE32_LOW_BYTE |
                Collation::LATIN_EXPANSION_TAG;
        }
    }
    // Try to encode two or more CEs as CE32s.
    int32_t newCE32s[Collation::MAX_EXPANSION_LENGTH];
    for(int32_t i = 0;; ++i) {
        if(i == cesLength) {
            return encodeExpansion32(newCE32s, cesLength, errorCode);
        }
        uint32_t ce32 = encodeOneCEAsCE32(ces[i]);
        if(ce32 == Collation::NO_CE32) { break; }
        newCE32s[i] = (int32_t)ce32;
    }
    return encodeExpansion(ces, cesLength, errorCode);
}